

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_harbor.c
# Opt level: O0

void forward_local_messsage(harbor *h,void *msg,int sz)

{
  uint uVar1;
  uint destination_00;
  int iVar2;
  int type;
  uint32_t destination;
  remote_message_header header;
  char *cookie;
  int sz_local;
  void *msg_local;
  harbor *h_local;
  
  header._4_8_ = (long)msg + (long)(sz + -0xc);
  message_to_header((uint32_t *)header._4_8_,(remote_message_header *)&type);
  uVar1 = destination >> 0x18;
  destination_00 = destination & 0xffffff | h->id << 0x18;
  iVar2 = skynet_send(h->ctx,type,destination_00,uVar1 | 0x10000,header.source,msg,(long)(sz + -0xc)
                     );
  if (iVar2 < 0) {
    if (uVar1 != 7) {
      skynet_send(h->ctx,destination_00,type,7,header.source,(void *)0x0,0);
    }
    skynet_error(h->ctx,"Unknown destination :%x from :%x type(%d)",(ulong)destination_00,
                 (ulong)(uint)type,(ulong)uVar1);
  }
  return;
}

Assistant:

static void
forward_local_messsage(struct harbor *h, void *msg, int sz) {
	const char * cookie = msg;
	cookie += sz - HEADER_COOKIE_LENGTH;
	struct remote_message_header header;
	message_to_header((const uint32_t *)cookie, &header);

	uint32_t destination = header.destination;
	int type = destination >> HANDLE_REMOTE_SHIFT;
	destination = (destination & HANDLE_MASK) | ((uint32_t)h->id << HANDLE_REMOTE_SHIFT);

	if (skynet_send(h->ctx, header.source, destination, type | PTYPE_TAG_DONTCOPY , (int)header.session, (void *)msg, sz-HEADER_COOKIE_LENGTH) < 0) {
		if (type != PTYPE_ERROR) {
			// don't need report error when type is error
			skynet_send(h->ctx, destination, header.source , PTYPE_ERROR, (int)header.session, NULL, 0);
		}
		skynet_error(h->ctx, "Unknown destination :%x from :%x type(%d)", destination, header.source, type);
	}
}